

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

isofile * isofile_new(archive_write *a,archive_entry *entry)

{
  isofile *__ptr;
  archive_entry *paVar1;
  
  __ptr = (isofile *)calloc(1,200);
  if (__ptr != (isofile *)0x0) {
    if (entry == (archive_entry *)0x0) {
      paVar1 = archive_entry_new2((archive_conflict *)a);
    }
    else {
      paVar1 = archive_entry_clone(entry);
    }
    __ptr->entry = paVar1;
    if (paVar1 != (archive_entry *)0x0) {
      __ptr->cur_content = &__ptr->content;
      return __ptr;
    }
    free(__ptr);
  }
  return (isofile *)0x0;
}

Assistant:

static struct isofile *
isofile_new(struct archive_write *a, struct archive_entry *entry)
{
	struct isofile *file;

	file = calloc(1, sizeof(*file));
	if (file == NULL)
		return (NULL);

	if (entry != NULL)
		file->entry = archive_entry_clone(entry);
	else
		file->entry = archive_entry_new2(&a->archive);
	if (file->entry == NULL) {
		free(file);
		return (NULL);
	}
	archive_string_init(&(file->parentdir));
	archive_string_init(&(file->basename));
	archive_string_init(&(file->basename_utf16));
	archive_string_init(&(file->symlink));
	file->cur_content = &(file->content);

	return (file);
}